

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::rotate
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          Dir dir)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  lVar8 = *(long *)this[2].rootNode;
  lVar7 = lVar8 + (long)x * 0x20;
  iVar1 = *(int *)(lVar7 + 0x10 + (ulong)(1 - dir) * 4);
  uVar3 = (ulong)dir;
  iVar2 = *(int *)(lVar8 + (long)iVar1 * 0x20 + 0x10 + uVar3 * 4);
  *(int *)(lVar7 + 0x10 + (ulong)(1 - dir) * 4) = iVar2;
  if ((long)iVar2 != -1) {
    lVar7 = (long)iVar2 * 0x20;
    *(uint *)(lVar8 + 0x18 + lVar7) = x + 1U | *(uint *)(lVar8 + 0x18 + lVar7) & 0x80000000;
  }
  lVar7 = (long)iVar1 * 0x20 + lVar8;
  puVar5 = (uint *)((long)x * 0x20 + lVar8 + 0x18);
  uVar6 = *puVar5 & 0x7fffffff;
  *(uint *)(lVar7 + 0x18) = *(uint *)(lVar7 + 0x18) & 0x80000000 | uVar6;
  if ((ulong)uVar6 == 0) {
    piVar4 = this->rootNode;
  }
  else {
    lVar8 = (ulong)uVar6 * 0x20 + lVar8;
    piVar4 = (int *)(lVar8 + (ulong)(*(int *)(lVar8 + -0x10 + uVar3 * 4) != x ^ dir) * 4 + -0x10);
  }
  *piVar4 = iVar1;
  *(LinkType *)(lVar7 + 0x10 + uVar3 * 4) = x;
  *puVar5 = iVar1 + 1U | *puVar5 & 0x80000000;
  return;
}

Assistant:

void rotate(LinkType x, Dir dir) {
    LinkType y = getChild(x, opposite(dir));
    LinkType yDir = getChild(y, dir);
    setChild(x, opposite(dir), yDir);
    if (yDir != kNoLink) setParent(yDir, x);

    LinkType pX = getParent(x);
    setParent(y, pX);

    if (pX == kNoLink)
      rootNode = y;
    else
      setChild(pX, Dir((x != getChild(pX, dir)) ^ dir), y);

    setChild(y, dir, x);
    setParent(x, y);
  }